

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pt_ild.c
# Opt level: O2

pt_exec_mode pti_get_nominal_eosz(pt_ild *ild)

{
  uint uVar1;
  
  if (ild->mode == ptem_64bit) {
    if ((*(uint *)&ild->field_0x10 >> 9 & 1) != 0) {
      return ptem_64bit;
    }
    uVar1 = *(uint *)&ild->field_0x10 & 1;
  }
  else {
    uVar1 = (uint)(((ild->field_0x10 & 1) == 0) != (ild->mode == ptem_32bit));
  }
  return ptem_32bit - uVar1;
}

Assistant:

static inline enum pt_exec_mode
pti_get_nominal_eosz(const struct pt_ild *ild)
{
	if (mode_64b(ild)) {
		if (ild->rex_w)
			return ptem_64bit;
		if (ild->osz)
			return ptem_16bit;
		return ptem_32bit;
	}
	return pti_get_nominal_eosz_non64(ild);
}